

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O3

void __thiscall
QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>::detach_helper
          (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate> *this)

{
  QRegularExpressionMatchIteratorPrivate *pQVar1;
  MatchOptions MVar2;
  QRegularExpressionMatchIteratorPrivate *pQVar3;
  
  pQVar3 = (QRegularExpressionMatchIteratorPrivate *)operator_new(0x20);
  pQVar1 = (this->d).ptr;
  (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  QRegularExpressionMatch::QRegularExpressionMatch(&pQVar3->next,&pQVar1->next);
  QRegularExpression::QRegularExpression(&pQVar3->regularExpression,&pQVar1->regularExpression);
  MVar2.super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>.
  super_QFlagsStorage<QRegularExpression::MatchOption>.i =
       (pQVar1->matchOptions).super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>;
  pQVar3->matchType = pQVar1->matchType;
  pQVar3->matchOptions =
       (MatchOptions)
       MVar2.super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>.
       super_QFlagsStorage<QRegularExpression::MatchOption>.i;
  LOCK();
  (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type_conflict)
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type_conflict)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type_conflict)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> == 0) {
    pQVar1 = (this->d).ptr;
    if (pQVar1 != (QRegularExpressionMatchIteratorPrivate *)0x0) {
      QRegularExpression::~QRegularExpression(&pQVar1->regularExpression);
      QRegularExpressionMatch::~QRegularExpressionMatch(&pQVar1->next);
    }
    operator_delete(pQVar1,0x20);
  }
  (this->d).ptr = pQVar3;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QExplicitlySharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d->ref.deref())
        delete d.get();
    d.reset(x);
}